

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O3

uint8_t FpgaIO::GetEthernetPortStatusV3(uint32_t status,uint chan)

{
  uint uVar1;
  
  uVar1 = BoardIO::GetFpgaVersionMajorFromStatus(status);
  if (uVar1 == 3) {
    if (chan == 2) {
      status = status >> 8;
      goto LAB_001197fb;
    }
    if (chan == 1) goto LAB_001197fb;
  }
  status = 0;
LAB_001197fb:
  return (uint8_t)status;
}

Assistant:

uint8_t FpgaIO::GetEthernetPortStatusV3(uint32_t status, unsigned int chan)
{
    uint8_t pstat = 0;
    if (GetFpgaVersionMajorFromStatus(status) == 3) {
        if (chan == 1)
            pstat = static_cast<uint8_t>(status&ETH_STAT_PORT1_MASK_V3);
        else if (chan == 2)
            pstat = static_cast<uint8_t>((status&ETH_STAT_PORT2_MASK_V3)>>8);
    }
    return pstat;
}